

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O0

RCO * __thiscall RCO::fileExtensionFromType(RCO *this,string *type)

{
  bool bVar1;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  string *local_18;
  string *type_local;
  
  local_18 = type;
  type_local = (string *)this;
  bVar1 = std::operator==(type,"texture/jpg");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"jpg",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    bVar1 = std::operator==(type,"texture/tif");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"tif",local_2d);
      std::allocator<char>::~allocator((allocator<char> *)local_2d);
    }
    else {
      bVar1 = std::operator==(type,"texture/gif");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,"gif",&local_2e);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e);
      }
      else {
        bVar1 = std::operator==(type,"texture/gxt");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)this,"gxt",&local_2f);
          std::allocator<char>::~allocator((allocator<char> *)&local_2f);
        }
        else {
          bVar1 = std::operator==(type,"texture/gim");
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)this,"gim",&local_30);
            std::allocator<char>::~allocator((allocator<char> *)&local_30);
          }
          else {
            bVar1 = std::operator==(type,"texture/png");
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)this,"png",&local_31);
              std::allocator<char>::~allocator((allocator<char> *)&local_31);
            }
            else {
              bVar1 = std::operator==(type,"png");
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)this,"png",&local_32);
                std::allocator<char>::~allocator((allocator<char> *)&local_32);
              }
              else {
                bVar1 = std::operator==(type,"texture/dds");
                if (bVar1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)this,"dds",&local_33);
                  std::allocator<char>::~allocator((allocator<char> *)&local_33);
                }
                else {
                  bVar1 = std::operator==(type,"sound/vag");
                  if (bVar1) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)this,"vag",&local_34);
                    std::allocator<char>::~allocator((allocator<char> *)&local_34);
                  }
                  else {
                    bVar1 = std::operator==(type,"sound/wav");
                    if (bVar1) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string((string *)this,"wav",&local_35);
                      std::allocator<char>::~allocator((allocator<char> *)&local_35);
                    }
                    else {
                      bVar1 = std::operator==(type,"sound/mp3");
                      if (bVar1) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string((string *)this,"mp3",&local_36);
                        std::allocator<char>::~allocator((allocator<char> *)&local_36);
                      }
                      else {
                        bVar1 = std::operator==(type,"sound/at3");
                        if (bVar1) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string((string *)this,"at3",&local_37);
                          std::allocator<char>::~allocator((allocator<char> *)&local_37);
                        }
                        else {
                          bVar1 = std::operator==(type,"sound/aac");
                          if (bVar1) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string((string *)this,"aac",&local_38);
                            std::allocator<char>::~allocator((allocator<char> *)&local_38);
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string((string *)this,"bin",&local_39);
                            std::allocator<char>::~allocator((allocator<char> *)&local_39);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

std::string RCO::fileExtensionFromType(std::string type)
{
	if (type == "texture/jpg")
		return "jpg";
	if (type == "texture/tif")
		return "tif";
	if (type == "texture/gif")
		return "gif";
	if (type == "texture/gxt")
		return "gxt";
	if (type == "texture/gim")
		return "gim";
	if (type == "texture/png")
		return "png";
	// Some PS4 RCOs have just png and not texture/png
	if (type == "png")
		return "png";
	if (type == "texture/dds")
		return "dds";
	if (type == "sound/vag")
		return "vag";
	if (type == "sound/wav")
		return "wav";
	if (type == "sound/mp3")
		return "mp3";
	if (type == "sound/at3")
		return "at3";
	if (type == "sound/aac")
		return "aac";
	return "bin";
}